

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_cwksp *ws;
  size_t sVar2;
  bool bVar3;
  ulong bytes;
  ZSTD_customMem customMem;
  uint uVar4;
  uint uVar5;
  ZSTD_strategy ZVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  size_t size;
  BYTE *pBVar12;
  seqDef *psVar13;
  ldmEntry_t *__s;
  rawSeq *prVar14;
  void *pvVar15;
  ZSTD_compressedBlockState_t *pZVar16;
  U32 *pUVar17;
  ulong uVar18;
  U64 UVar19;
  size_t err_code;
  ulong maxChunkSize;
  size_t sVar20;
  ZSTD_indexResetPolicy_e local_8c;
  size_t local_80;
  
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xb0);
  params_00 = &(zc->appliedParams).ldmParams;
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
  }
  UVar19 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= UVar19) {
    UVar19 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    UVar19 = 1;
  }
  maxChunkSize = 0x20000;
  if (UVar19 < 0x20000) {
    maxChunkSize = UVar19;
  }
  local_80 = 0;
  bytes = (maxChunkSize & 0xffffffff) / (ulong)(((zc->appliedParams).cParams.minMatch != 3) + 3);
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      uVar18 = 0;
      if (UVar19 < 0x20000) {
        uVar18 = (ulong)(0x20000U - (int)maxChunkSize >> 0xb);
      }
      local_80 = (maxChunkSize >> 8) + maxChunkSize + uVar18 + 1;
    }
    else {
      local_80 = 0;
    }
    sVar20 = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      sVar20 = UVar19 + maxChunkSize;
    }
  }
  else {
    sVar20 = 0;
  }
  cParams = &(zc->appliedParams).cParams;
  sVar11 = ZSTD_ldm_getMaxNbSeq(*params_00,maxChunkSize);
  local_8c = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    local_8c = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  size = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                   (cParams,params_00,(uint)(zc->staticSize != 0),
                    (zc->appliedParams).useRowMatchFinder,sVar20,local_80,pledgedSrcSize);
  if (0xffffffffffffff88 < size) {
    return size;
  }
  sVar2 = zc->staticSize;
  if (sVar2 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar15 = (zc->workspace).workspace;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < size * 3) {
    bVar3 = false;
  }
  else {
    bVar3 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  ws = &zc->workspace;
  if (((ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar15) < size) || (bVar3)) {
    if (sVar2 != 0) {
      return 0xffffffffffffffc0;
    }
    customMem = zc->customMem;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x31 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    ZSTD_customFree(pvVar15,customMem);
    pvVar15 = ZSTD_customMalloc(size,zc->customMem);
    if (pvVar15 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_cwksp_init(ws,pvVar15,size,ZSTD_cwksp_dynamic_alloc);
    pZVar16 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x11f0);
    (zc->blockState).prevCBlock = pZVar16;
    if (pZVar16 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar16 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x11f0);
    (zc->blockState).nextCBlock = pZVar16;
    if (pZVar16 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar17 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x19d8);
    zc->entropyWorkspace = pUVar17;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    local_8c = ZSTDirp_reset;
  }
  ZSTD_cwksp_clear(ws);
  uVar7 = cParams->windowLog;
  uVar8 = cParams->chainLog;
  uVar9 = (zc->appliedParams).cParams.hashLog;
  uVar10 = (zc->appliedParams).cParams.searchLog;
  uVar4 = (zc->appliedParams).cParams.minMatch;
  uVar5 = (zc->appliedParams).cParams.targetLength;
  ZVar6 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar4;
  (zc->blockState).matchState.cParams.targetLength = uVar5;
  (zc->blockState).matchState.cParams.strategy = ZVar6;
  (zc->blockState).matchState.cParams.windowLog = uVar7;
  (zc->blockState).matchState.cParams.chainLog = uVar8;
  (zc->blockState).matchState.cParams.hashLog = uVar9;
  (zc->blockState).matchState.cParams.searchLog = uVar10;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = maxChunkSize;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  pBVar12 = ZSTD_cwksp_reserve_buffer(ws,maxChunkSize + 0x20);
  (zc->seqStore).litStart = pBVar12;
  (zc->seqStore).maxNbLit = maxChunkSize;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = sVar20;
  pBVar12 = ZSTD_cwksp_reserve_buffer(ws,sVar20);
  zc->inBuff = (char *)pBVar12;
  zc->outBuffSize = local_80;
  pBVar12 = ZSTD_cwksp_reserve_buffer(ws,local_80);
  zc->outBuff = (char *)pBVar12;
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    sVar20 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                    (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    pBVar12 = ZSTD_cwksp_reserve_buffer(ws,sVar20);
    (zc->ldmState).bucketOffsets = pBVar12;
    memset(pBVar12,0,sVar20);
  }
  ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
  (zc->seqStore).maxNbSeq = bytes;
  pBVar12 = ZSTD_cwksp_reserve_buffer(ws,bytes);
  (zc->seqStore).llCode = pBVar12;
  pBVar12 = ZSTD_cwksp_reserve_buffer(ws,bytes);
  (zc->seqStore).mlCode = pBVar12;
  pBVar12 = ZSTD_cwksp_reserve_buffer(ws,bytes);
  (zc->seqStore).ofCode = pBVar12;
  psVar13 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,bytes << 3);
  (zc->seqStore).sequencesStart = psVar13;
  sVar20 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,ws,cParams,(zc->appliedParams).useRowMatchFinder,
                      crp,local_8c,ZSTD_resetTarget_CCtx);
  if (sVar20 < 0xffffffffffffff89) {
    if (params_00->enableLdm != 0) {
      sVar20 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
      __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,sVar20);
      (zc->ldmState).hashTable = __s;
      memset(__s,0,sVar20);
      prVar14 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,sVar11 * 0xc);
      zc->ldmSequences = prVar14;
      zc->maxNbLdmSequences = sVar11;
      *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
      (zc->ldmState).window.base = "";
      (zc->ldmState).window.dictBase = "";
      (zc->ldmState).window.dictLimit = 1;
      (zc->ldmState).window.lowLimit = 1;
      (zc->ldmState).window.nextSrc = (BYTE *)"PK\x06\x06";
      (zc->ldmState).loadedDictEnd = 0;
    }
    zc->initialized = 1;
    sVar20 = 0;
  }
  return sVar20;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_urm_auto);
    if (params->ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params->cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params->cParams,
            params->useRowMatchFinder,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx), "");

        /* ldm hash table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace, resizeWorkspace));
        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));

        zc->initialized = 1;

        return 0;
    }
}